

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompress.c
# Opt level: O1

void WritePTLen(INT32 Number,INT32 nbit,INT32 Special)

{
  char *pcVar1;
  byte bVar2;
  ulong uVar3;
  UINT32 UVar4;
  uint Value;
  uint Value_00;
  int iVar5;
  int iVar6;
  long lVar7;
  
  uVar3 = (ulong)(uint)Number;
  UVar4 = Number + 1;
  do {
    Value = Number >> 0x1f & Number;
    if ((int)uVar3 < 1) break;
    UVar4 = UVar4 - 1;
    pcVar1 = &DAT_002bb00f + uVar3;
    uVar3 = uVar3 - 1;
    Value = UVar4;
  } while (*pcVar1 == '\0');
  PutBits(nbit,Value);
  if (0 < (int)Value) {
    iVar6 = 0;
    do {
      lVar7 = (long)iVar6;
      bVar2 = mPTLen[lVar7];
      if (bVar2 < 7) {
        iVar5 = 3;
        Value_00 = (uint)bVar2;
      }
      else {
        iVar5 = bVar2 - 3;
        Value_00 = (1 << ((byte)iVar5 & 0x1f)) - 2;
      }
      PutBits(iVar5,Value_00);
      iVar5 = iVar6 + 1;
      if (iVar5 == Special) {
        if (iVar6 < 5) {
          do {
            if (mPTLen[lVar7 + 1] != '\0') goto LAB_001a294f;
            iVar5 = iVar5 + 1;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 5);
          iVar5 = 6;
        }
LAB_001a294f:
        PutBits(2,iVar5 + 1U & 3);
      }
      iVar6 = iVar5;
    } while (iVar6 < (int)Value);
  }
  return;
}

Assistant:

STATIC 
VOID 
WritePTLen (
  IN INT32 n, 
  IN INT32 nbit, 
  IN INT32 Special
  )
/*++

Routine Description:

  Outputs the code length array for the Extra Set or the Position Set.
  
Arguments:

  n       - the number of symbols
  nbit    - the number of bits needed to represent 'n'
  Special - the special symbol that needs to be take care of
  
Returns: (VOID)

--*/
{
  INT32 i, k;

  while (n > 0 && mPTLen[n - 1] == 0) {
    n--;
  }
  PutBits(nbit, n);
  i = 0;
  while (i < n) {
    k = mPTLen[i++];
    if (k <= 6) {
      PutBits(3, k);
    } else {
      PutBits(k - 3, (1U << (k - 3)) - 2);
    }
    if (i == Special) {
      while (i < 6 && mPTLen[i] == 0) {
        i++;
      }
      PutBits(2, (i - 3) & 3);
    }
  }
}